

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::anon_unknown_1::TimerManager::InternalStop(TimerManager *this)

{
  WallTime WVar1;
  double dVar2;
  double dVar3;
  CheckHandler local_10;
  
  if (this->running_ != false) {
    internal::GetNullLogInstance();
    this->running_ = false;
    WVar1 = walltime::Now();
    this->real_time_used_ = (WVar1 - this->start_real_time_) + this->real_time_used_;
    dVar2 = MyCPUUsage();
    dVar3 = ChildrenCPUUsage();
    this->cpu_time_used_ = ((dVar3 + dVar2) - this->start_cpu_time_) + this->cpu_time_used_;
    return;
  }
  internal::CheckHandler::CheckHandler
            (&local_10,"running_",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"InternalStop",0x118);
  internal::CheckHandler::~CheckHandler(&local_10);
}

Assistant:

REQUIRES(lock_) {
    CHECK(running_);
    running_ = false;
    real_time_used_ += walltime::Now() - start_real_time_;
    cpu_time_used_ += ((MyCPUUsage() + ChildrenCPUUsage())
                       - start_cpu_time_);
  }